

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jdsample.c
# Opt level: O0

void h2v1_upsample(j_decompress_ptr cinfo,jpeg_component_info *compptr,JSAMPARRAY input_data,
                  JSAMPARRAY *output_data_ptr)

{
  JSAMPLE JVar1;
  JSAMPARRAY ppJVar2;
  JSAMPROW pJVar3;
  JSAMPLE *pJVar4;
  int inrow;
  JSAMPROW outend;
  JSAMPLE invalue;
  JSAMPROW outptr;
  JSAMPROW inptr;
  JSAMPARRAY output_data;
  JSAMPARRAY *output_data_ptr_local;
  JSAMPARRAY input_data_local;
  jpeg_component_info *compptr_local;
  j_decompress_ptr cinfo_local;
  
  ppJVar2 = *output_data_ptr;
  for (inrow = 0; inrow < cinfo->max_v_samp_factor; inrow = inrow + 1) {
    outptr = ppJVar2[inrow];
    pJVar3 = outptr + cinfo->output_width;
    inptr = input_data[inrow];
    while (outptr < pJVar3) {
      JVar1 = *inptr;
      pJVar4 = outptr + 1;
      *outptr = JVar1;
      outptr = outptr + 2;
      *pJVar4 = JVar1;
      inptr = inptr + 1;
    }
  }
  return;
}

Assistant:

METHODDEF(void)
h2v1_upsample(j_decompress_ptr cinfo, jpeg_component_info *compptr,
              JSAMPARRAY input_data, JSAMPARRAY *output_data_ptr)
{
  JSAMPARRAY output_data = *output_data_ptr;
  register JSAMPROW inptr, outptr;
  register JSAMPLE invalue;
  JSAMPROW outend;
  int inrow;

  for (inrow = 0; inrow < cinfo->max_v_samp_factor; inrow++) {
    inptr = input_data[inrow];
    outptr = output_data[inrow];
    outend = outptr + cinfo->output_width;
    while (outptr < outend) {
      invalue = *inptr++;
      *outptr++ = invalue;
      *outptr++ = invalue;
    }
  }
}